

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,Statement *stmt)

{
  DataFlowState local_b8;
  
  DataFlowAnalysis::topState(&local_b8,(DataFlowAnalysis *)this);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&this->state
             ,(SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_b8);
  (this->state).reachable = local_b8.reachable;
  if (local_b8.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_b8.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_b8.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt,(DataFlowAnalysis *)this);
  return;
}

Assistant:

void run(const Statement& stmt) {
        state = (DERIVED).topState();
        visit(stmt);
    }